

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O1

bool Unicode::append(uint32 ch,String *str)

{
  Data *pDVar1;
  char *pcVar2;
  usize uVar3;
  
  if (0x7f < ch) {
    if (ch < 0x800) {
      uVar3 = str->data->len;
      String::detach(str,uVar3,uVar3 + 1);
      str->data->str[str->data->len] = (byte)(ch >> 6) | 0xc0;
      pDVar1 = str->data;
      pDVar1->len = uVar3 + 1;
      pDVar1->str[uVar3 + 1] = '\0';
    }
    else {
      if (ch < 0x10000) {
        uVar3 = str->data->len;
        String::detach(str,uVar3,uVar3 + 1);
        str->data->str[str->data->len] = (byte)(ch >> 0xc) | 0xe0;
        pcVar2 = str->data->str;
        str->data->len = uVar3 + 1;
      }
      else {
        if (0x10ffff < ch) {
          return false;
        }
        uVar3 = str->data->len;
        String::detach(str,uVar3,uVar3 + 1);
        str->data->str[str->data->len] = (byte)(ch >> 0x12) | 0xf0;
        pDVar1 = str->data;
        pDVar1->len = uVar3 + 1;
        pDVar1->str[uVar3 + 1] = '\0';
        uVar3 = str->data->len;
        String::detach(str,uVar3,uVar3 + 1);
        str->data->str[str->data->len] = (byte)(ch >> 0xc) & 0x3f | 0x80;
        pcVar2 = str->data->str;
        str->data->len = uVar3 + 1;
      }
      pcVar2[uVar3 + 1] = '\0';
      uVar3 = str->data->len;
      String::detach(str,uVar3,uVar3 + 1);
      str->data->str[str->data->len] = (byte)(ch >> 6) & 0x3f | 0x80;
      pDVar1 = str->data;
      pDVar1->len = uVar3 + 1;
      pDVar1->str[uVar3 + 1] = '\0';
    }
    ch = (uint32)((byte)ch & 0x3f | 0x80);
  }
  uVar3 = str->data->len;
  String::detach(str,uVar3,uVar3 + 1);
  str->data->str[str->data->len] = (char)ch;
  pDVar1 = str->data;
  pDVar1->len = uVar3 + 1;
  pDVar1->str[uVar3 + 1] = '\0';
  return true;
}

Assistant:

static bool append(uint32 ch, String& str)
  {
#ifdef _UNICODE
    if((ch & ~(0x10000UL - 1)) == 0) // ch < 0x10000
    {
      if((ch & 0xF800ULL) != 0xD800ULL) // ch < 0xD800 || ch > 0xDFFF
      {
        str.append((tchar)ch);
        return true;
      }
      return false;
    }
    if(ch < 0x110000UL)
    {
      ch -= 0x10000UL;
      str.append((tchar)((ch >> 10) | 0xD800UL));
      str.append((ch & 0x3ffULL) | 0xDC00UL);
      return true;
    }
#else
    if((ch & ~(0x80UL - 1)) == 0) // ch < 0x80
    {
      str.append((char)ch);
      return true;
    }
    if((ch & ~(0x800UL - 1)) == 0) // ch < 0x800
    {
      str.append((ch >> 6) | 0xC0);
      str.append((ch & 0x3F) | 0x80);
      return true;
    }
    if((ch & ~(0x10000UL - 1)) == 0) // ch < 0x10000
    {
      str.append((ch >> 12) | 0xE0);
      str.append(((ch >> 6) & 0x3F) | 0x80);
      str.append((ch & 0x3F) | 0x80);
      return true;
    }
    if(ch < 0x110000UL)
    {
      str.append((ch >> 18) | 0xF0);
      str.append(((ch >> 12) & 0x3F) | 0x80);
      str.append(((ch >> 6) & 0x3F) | 0x80);
      str.append((ch & 0x3F) | 0x80);
      return true;
    }
#endif
    return false;
  }